

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O0

void ScaWrd(GmfMshSct *msh,void *ptr)

{
  size_t sVar1;
  char *in_RSI;
  long in_RDI;
  
  sVar1 = fread(in_RSI,4,1,*(FILE **)(in_RDI + 0x300410));
  if (sVar1 != 1) {
    longjmp((__jmp_buf_tag *)(in_RDI + 0x48),-0x1a);
  }
  if (*(int *)(in_RDI + 0x10) != 1) {
    SwpWrd(in_RSI,4);
  }
  return;
}

Assistant:

static void ScaWrd(GmfMshSct *msh, void *ptr)
{
#ifdef WITH_GMF_AIO
   if(read(msh->FilDes, ptr, WrdSiz) != WrdSiz)
#else
   if(fread(ptr, WrdSiz, 1, msh->hdl) != 1)
#endif
      longjmp(msh->err, -26);

   if(msh->cod != 1)
      SwpWrd((char *)ptr, WrdSiz);
}